

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaJsonWriter::EndObject(VmaJsonWriter *this)

{
  VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_> *in_RDI;
  VmaJsonWriter *unaff_retaddr;
  char in_stack_ffffffffffffffef;
  
  WriteIndent(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  VmaStringBuilder::Add((VmaStringBuilder *)in_RDI,in_stack_ffffffffffffffef);
  VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_>::pop_back(in_RDI);
  return;
}

Assistant:

void VmaJsonWriter::EndObject()
{
    VMA_ASSERT(!m_InsideString);

    WriteIndent(true);
    m_SB.Add('}');

    VMA_ASSERT(!m_Stack.empty() && m_Stack.back().type == COLLECTION_TYPE_OBJECT);
    m_Stack.pop_back();
}